

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_allow_multiple(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong __n;
  void *__s1;
  void *__s2;
  undefined8 extraout_RAX;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  int *unaff_R12;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  uint *__seed;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar43;
  undefined1 auVar38 [16];
  int iVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar105;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iVar106;
  int iVar118;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  int32_t one;
  bson_t bson;
  bson_error_t error;
  undefined1 auStack_83c [12];
  ulong uStack_830;
  char *pcStack_828;
  char *pcStack_820;
  char *pcStack_818;
  uint *puStack_810;
  code *pcStack_808;
  char acStack_800 [32];
  char acStack_7e0 [32];
  undefined8 *puStack_7c0;
  char *pcStack_7b8;
  int iStack_7ac;
  void *pvStack_7a8;
  void *pvStack_7a0;
  char *pcStack_798;
  long lStack_790;
  uint uStack_784;
  undefined1 auStack_780 [16];
  undefined1 auStack_770 [16];
  undefined1 auStack_760 [16];
  undefined1 auStack_750 [16];
  undefined1 auStack_740 [16];
  undefined1 auStack_730 [16];
  undefined1 auStack_720 [16];
  undefined1 auStack_710 [16];
  undefined1 auStack_6b8 [648];
  long lStack_430;
  int *piStack_428;
  code *apcStack_408 [16];
  int local_384;
  int local_380 [52];
  undefined1 local_2b0 [648];
  
  local_380[0x1c] = 0;
  local_380[0x1d] = 0;
  local_380[0x1e] = 0;
  local_380[0x1f] = 0;
  local_380[0x18] = 0;
  local_380[0x19] = 0;
  local_380[0x1a] = 0;
  local_380[0x1b] = 0;
  local_380[0x14] = 0;
  local_380[0x15] = 0;
  local_380[0x16] = 0;
  local_380[0x17] = 0;
  local_380[0x10] = 0;
  local_380[0x11] = 0;
  local_380[0x12] = 0;
  local_380[0x13] = 0;
  local_380[0xc] = 0;
  local_380[0xd] = 0;
  local_380[0xe] = 0;
  local_380[0xf] = 0;
  local_380[8] = 0;
  local_380[9] = 0;
  local_380[10] = 0;
  local_380[0xb] = 0;
  local_380[4] = 0;
  local_380[5] = 0;
  local_380[6] = 0;
  local_380[7] = 0;
  local_380[0] = 3;
  local_380[1] = 5;
  local_380[2] = 5;
  local_380[3] = 0;
  pcVar12 = "{\"a\": 1}{\"b\": 1}";
  apcStack_408[0] = (code *)0x12df33;
  lVar4 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_408[0] = (code *)0x12df4b;
  pcVar5 = (char *)bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (lVar4 == 0) {
    apcStack_408[0] = (code *)0x12e1d8;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e1d8:
    apcStack_408[0] = (code *)0x12e1dd;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e1dd:
    apcStack_408[0] = (code *)0x12e1f5;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e1f5:
    apcStack_408[0] = (code *)0x12e1fa;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e1fa:
    apcStack_408[0] = (code *)0x12e212;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e212:
    apcStack_408[0] = (code *)0x12e217;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e217:
    apcStack_408[0] = (code *)0x12e22f;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e22f:
    apcStack_408[0] = (code *)0x12e234;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e234:
    apcStack_408[0] = (code *)0x12e24c;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e24c:
    apcStack_408[0] = (code *)0x12e251;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e251:
    apcStack_408[0] = (code *)0x12e269;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e269:
    apcStack_408[0] = (code *)0x12e26e;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    pcVar12 = pcVar5;
    if (pcVar5 == (char *)0x0) goto LAB_0012e1d8;
    apcStack_408[0] = (code *)0x12df78;
    iVar2 = bson_json_reader_read(lVar4,local_380,local_2b0);
    if (iVar2 != 1) goto LAB_0012e1dd;
    apcStack_408[0] = (code *)0x12df86;
    uVar6 = bson_bcone_magic();
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12dfb2;
    bcon_extract(local_380,"a",uVar6,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e1f5;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12dfcf;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12dfe2;
    iVar2 = bson_json_reader_read(lVar4,unaff_R12,local_2b0);
    if (iVar2 != 1) goto LAB_0012e1fa;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e014;
    bcon_extract(local_380,"b",uVar6,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e212;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e031;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e044;
    iVar2 = bson_json_reader_read(lVar4,unaff_R12,local_2b0);
    if (iVar2 != 1) goto LAB_0012e217;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e076;
    bcon_extract(local_380,"a",uVar6,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e22f;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e093;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e0a6;
    iVar2 = bson_json_reader_read(pcVar5,unaff_R12,local_2b0);
    if (iVar2 != 1) goto LAB_0012e234;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e0d8;
    bcon_extract(local_380,"a",uVar6,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e24c;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e0f5;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e108;
    iVar2 = bson_json_reader_read(pcVar5,unaff_R12,local_2b0);
    if (iVar2 != 1) goto LAB_0012e251;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e13a;
    bcon_extract(local_380,"b",uVar6,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e269;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e157;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e16a;
    iVar2 = bson_json_reader_read(pcVar5,unaff_R12,local_2b0);
    if (iVar2 == 1) {
      unaff_R12 = &local_384;
      apcStack_408[0] = (code *)0x12e19c;
      bcon_extract(local_380,"a",uVar6,0xf,unaff_R12,0);
      if (local_384 == 1) {
        apcStack_408[0] = (code *)0x12e1b1;
        bson_json_reader_destroy(lVar4);
        apcStack_408[0] = (code *)0x12e1b9;
        bson_json_reader_destroy(pcVar5);
        apcStack_408[0] = (code *)0x12e1c6;
        bson_destroy(local_380);
        return;
      }
      goto LAB_0012e286;
    }
  }
  apcStack_408[0] = (code *)0x12e286;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e286:
  apcStack_408[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  auStack_710 = (undefined1  [16])0x0;
  auStack_720 = (undefined1  [16])0x0;
  auStack_730 = (undefined1  [16])0x0;
  auStack_740 = (undefined1  [16])0x0;
  auStack_750 = (undefined1  [16])0x0;
  auStack_760 = (undefined1  [16])0x0;
  auStack_770 = (undefined1  [16])0x0;
  auStack_780[8] = 5;
  auStack_780._0_8_ = 0x500000003;
  auStack_780._9_7_ = 0;
  __seed = &uStack_784;
  uStack_784 = 0x2a;
  pcStack_808 = (code *)0x12e2fa;
  lStack_430 = lVar4;
  piStack_428 = unaff_R12;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  puStack_7c0 = (undefined8 *)bson_string_new(0);
  pcVar5 = (char *)0x1;
LAB_0012e305:
  lStack_790 = (long)pcVar5 * 8;
  iVar2 = 0;
  pcStack_798 = pcVar5;
LAB_0012e319:
  pcStack_808 = (code *)0x12e322;
  iStack_7ac = iVar2;
  __n = bson_malloc(lStack_790);
  pcVar10 = (char *)0x0;
  do {
    pcStack_808 = (code *)0x12e32d;
    uVar6 = bson_new();
    *(undefined8 *)(__n + (long)pcVar10 * 8) = uVar6;
    pcStack_808 = (code *)0x12e339;
    iVar2 = rand_r(__seed);
    pcStack_7b8 = (char *)(ulong)(uint)(iVar2 % 5);
    if (0 < iVar2 % 5) {
      pcVar12 = (char *)0x0;
      do {
        uVar6 = *(undefined8 *)(__n + (long)pcVar10 * 8);
        pcStack_808 = (code *)0x12e371;
        iVar2 = rand_r(__seed);
        lVar4 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar4 != 0) {
          lVar19 = lVar4 + -1;
          auVar14._8_4_ = (int)lVar19;
          auVar14._0_8_ = lVar19;
          auVar14._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar9 = 0;
          auVar40 = _DAT_00147390;
          auVar56 = _DAT_00147380;
          auVar124 = _DAT_00147370;
          auVar90 = _DAT_00147360;
          auVar26 = _DAT_00147350;
          auVar29 = _DAT_00147340;
          auVar32 = _DAT_00147330;
          auVar35 = _DAT_00147320;
          do {
            auVar38 = auVar14 ^ _DAT_001473a0;
            auVar45 = auVar40 ^ _DAT_001473a0;
            iVar2 = auVar38._0_4_;
            iVar106 = -(uint)(iVar2 < auVar45._0_4_);
            iVar105 = auVar38._4_4_;
            auVar46._4_4_ = -(uint)(iVar105 < auVar45._4_4_);
            iVar43 = auVar38._8_4_;
            iVar118 = -(uint)(iVar43 < auVar45._8_4_);
            iVar44 = auVar38._12_4_;
            auVar46._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
            auVar81._4_4_ = iVar106;
            auVar81._0_4_ = iVar106;
            auVar81._8_4_ = iVar118;
            auVar81._12_4_ = iVar118;
            auVar119 = pshuflw(in_XMM13,auVar81,0xe8);
            auVar38._4_4_ = -(uint)(auVar45._4_4_ == iVar105);
            auVar38._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar120 = pshuflw(in_XMM14,auVar38,0xe8);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar45 = pshuflw(auVar119,auVar46,0xe8);
            auVar121._8_4_ = 0xffffffff;
            auVar121._0_8_ = 0xffffffffffffffff;
            auVar121._12_4_ = 0xffffffff;
            auVar45 = (auVar45 | auVar120 & auVar119) ^ auVar121;
            auVar45 = packssdw(auVar45,auVar45);
            cVar1 = (char)uVar9;
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_800[uVar9] = cVar1 + 'a';
            }
            auVar46 = auVar38 & auVar81 | auVar46;
            auVar38 = packssdw(auVar46,auVar46);
            auVar38 = packssdw(auVar38 ^ auVar121,auVar38 ^ auVar121);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 1] = cVar1 + 'b';
            }
            auVar38 = auVar56 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar38._0_4_);
            auVar120._4_4_ = -(uint)(iVar105 < auVar38._4_4_);
            iVar118 = -(uint)(iVar43 < auVar38._8_4_);
            auVar120._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
            auVar45._4_4_ = iVar106;
            auVar45._0_4_ = iVar106;
            auVar45._8_4_ = iVar118;
            auVar45._12_4_ = iVar118;
            auVar119._4_4_ = -(uint)(auVar38._4_4_ == iVar105);
            auVar119._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
            auVar119._0_4_ = auVar119._4_4_;
            auVar119._8_4_ = auVar119._12_4_;
            auVar120._0_4_ = auVar120._4_4_;
            auVar120._8_4_ = auVar120._12_4_;
            auVar38 = auVar119 & auVar45 | auVar120;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar121,auVar38 ^ auVar121);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
              acStack_800[uVar9 + 2] = cVar1 + 'c';
            }
            auVar45 = pshufhw(auVar45,auVar45,0x84);
            auVar81 = pshufhw(auVar119,auVar119,0x84);
            auVar46 = pshufhw(auVar45,auVar120,0x84);
            auVar45 = (auVar46 | auVar81 & auVar45) ^ auVar121;
            auVar45 = packssdw(auVar45,auVar45);
            auVar45 = packsswb(auVar45,auVar45);
            if ((auVar45._0_4_ >> 0x18 & 1) != 0) {
              acStack_800[uVar9 + 3] = cVar1 + 'd';
            }
            auVar45 = auVar124 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar45._0_4_);
            auVar48._4_4_ = -(uint)(iVar105 < auVar45._4_4_);
            iVar118 = -(uint)(iVar43 < auVar45._8_4_);
            auVar48._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
            auVar82._4_4_ = iVar106;
            auVar82._0_4_ = iVar106;
            auVar82._8_4_ = iVar118;
            auVar82._12_4_ = iVar118;
            auVar38 = pshuflw(auVar38,auVar82,0xe8);
            auVar47._4_4_ = -(uint)(auVar45._4_4_ == iVar105);
            auVar47._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar46 = pshuflw(auVar121,auVar47,0xe8);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar45 = pshuflw(auVar38,auVar48,0xe8);
            auVar122._8_4_ = 0xffffffff;
            auVar122._0_8_ = 0xffffffffffffffff;
            auVar122._12_4_ = 0xffffffff;
            auVar38 = (auVar45 | auVar46 & auVar38) ^ auVar122;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 4] = cVar1 + 'e';
            }
            auVar48 = auVar47 & auVar82 | auVar48;
            auVar38 = packssdw(auVar48,auVar48);
            auVar38 = packssdw(auVar38 ^ auVar122,auVar38 ^ auVar122);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._4_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 5] = cVar1 + 'f';
            }
            auVar38 = auVar90 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar38._0_4_);
            auVar107._4_4_ = -(uint)(iVar105 < auVar38._4_4_);
            iVar118 = -(uint)(iVar43 < auVar38._8_4_);
            auVar107._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
            auVar49._4_4_ = iVar106;
            auVar49._0_4_ = iVar106;
            auVar49._8_4_ = iVar118;
            auVar49._12_4_ = iVar118;
            auVar83._4_4_ = -(uint)(auVar38._4_4_ == iVar105);
            auVar83._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar107._0_4_ = auVar107._4_4_;
            auVar107._8_4_ = auVar107._12_4_;
            auVar38 = auVar83 & auVar49 | auVar107;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar122,auVar38 ^ auVar122);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 6] = cVar1 + 'g';
            }
            auVar45 = pshufhw(auVar49,auVar49,0x84);
            auVar81 = pshufhw(auVar83,auVar83,0x84);
            auVar46 = pshufhw(auVar45,auVar107,0x84);
            auVar45 = (auVar46 | auVar81 & auVar45) ^ auVar122;
            auVar45 = packssdw(auVar45,auVar45);
            auVar45 = packsswb(auVar45,auVar45);
            if ((auVar45._6_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 7] = cVar1 + 'h';
            }
            auVar45 = auVar26 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar45._0_4_);
            auVar51._4_4_ = -(uint)(iVar105 < auVar45._4_4_);
            iVar118 = -(uint)(iVar43 < auVar45._8_4_);
            auVar51._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
            auVar84._4_4_ = iVar106;
            auVar84._0_4_ = iVar106;
            auVar84._8_4_ = iVar118;
            auVar84._12_4_ = iVar118;
            auVar38 = pshuflw(auVar38,auVar84,0xe8);
            auVar50._4_4_ = -(uint)(auVar45._4_4_ == iVar105);
            auVar50._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar46 = pshuflw(auVar122,auVar50,0xe8);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar45 = pshuflw(auVar38,auVar51,0xe8);
            auVar123._8_4_ = 0xffffffff;
            auVar123._0_8_ = 0xffffffffffffffff;
            auVar123._12_4_ = 0xffffffff;
            auVar38 = (auVar45 | auVar46 & auVar38) ^ auVar123;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 8] = cVar1 + 'i';
            }
            auVar51 = auVar50 & auVar84 | auVar51;
            auVar38 = packssdw(auVar51,auVar51);
            auVar38 = packssdw(auVar38 ^ auVar123,auVar38 ^ auVar123);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._8_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 9] = cVar1 + 'j';
            }
            auVar38 = auVar29 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar38._0_4_);
            auVar108._4_4_ = -(uint)(iVar105 < auVar38._4_4_);
            iVar118 = -(uint)(iVar43 < auVar38._8_4_);
            auVar108._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
            auVar52._4_4_ = iVar106;
            auVar52._0_4_ = iVar106;
            auVar52._8_4_ = iVar118;
            auVar52._12_4_ = iVar118;
            auVar85._4_4_ = -(uint)(auVar38._4_4_ == iVar105);
            auVar85._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            auVar108._0_4_ = auVar108._4_4_;
            auVar108._8_4_ = auVar108._12_4_;
            auVar38 = auVar85 & auVar52 | auVar108;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar123,auVar38 ^ auVar123);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 10] = cVar1 + 'k';
            }
            auVar45 = pshufhw(auVar52,auVar52,0x84);
            auVar81 = pshufhw(auVar85,auVar85,0x84);
            auVar46 = pshufhw(auVar45,auVar108,0x84);
            auVar45 = (auVar46 | auVar81 & auVar45) ^ auVar123;
            auVar45 = packssdw(auVar45,auVar45);
            auVar45 = packsswb(auVar45,auVar45);
            if ((auVar45._10_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xb] = cVar1 + 'l';
            }
            auVar45 = auVar32 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar45._0_4_);
            auVar54._4_4_ = -(uint)(iVar105 < auVar45._4_4_);
            iVar118 = -(uint)(iVar43 < auVar45._8_4_);
            auVar54._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
            auVar86._4_4_ = iVar106;
            auVar86._0_4_ = iVar106;
            auVar86._8_4_ = iVar118;
            auVar86._12_4_ = iVar118;
            auVar38 = pshuflw(auVar38,auVar86,0xe8);
            auVar53._4_4_ = -(uint)(auVar45._4_4_ == iVar105);
            auVar53._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar46 = pshuflw(auVar123,auVar53,0xe8);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar45 = pshuflw(auVar38,auVar54,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar38 = (auVar45 | auVar46 & auVar38) ^ in_XMM14;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 0xc] = cVar1 + 'm';
            }
            auVar54 = auVar53 & auVar86 | auVar54;
            auVar38 = packssdw(auVar54,auVar54);
            auVar38 = packssdw(auVar38 ^ in_XMM14,auVar38 ^ in_XMM14);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._12_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xd] = cVar1 + 'n';
            }
            auVar38 = auVar35 ^ _DAT_001473a0;
            auVar109._0_4_ = -(uint)(iVar2 < auVar38._0_4_);
            auVar109._4_4_ = -(uint)(iVar105 < auVar38._4_4_);
            auVar109._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
            auVar109._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
            auVar55._4_4_ = auVar109._0_4_;
            auVar55._0_4_ = auVar109._0_4_;
            auVar55._8_4_ = auVar109._8_4_;
            auVar55._12_4_ = auVar109._8_4_;
            iVar2 = -(uint)(auVar38._4_4_ == iVar105);
            iVar105 = -(uint)(auVar38._12_4_ == iVar44);
            auVar39._4_4_ = iVar2;
            auVar39._0_4_ = iVar2;
            auVar39._8_4_ = iVar105;
            auVar39._12_4_ = iVar105;
            auVar87._4_4_ = auVar109._4_4_;
            auVar87._0_4_ = auVar109._4_4_;
            auVar87._8_4_ = auVar109._12_4_;
            auVar87._12_4_ = auVar109._12_4_;
            in_XMM13 = auVar39 & auVar55 | auVar87;
            auVar38 = packssdw(auVar109,in_XMM13);
            auVar38 = packssdw(auVar38 ^ in_XMM14,auVar38 ^ in_XMM14);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 0xe] = cVar1 + 'o';
            }
            auVar45 = pshufhw(auVar55,auVar55,0x84);
            auVar38 = pshufhw(auVar39,auVar39,0x84);
            auVar46 = pshufhw(auVar45,auVar87,0x84);
            auVar38 = packssdw(auVar38 & auVar45,(auVar46 | auVar38 & auVar45) ^ in_XMM14);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._14_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xf] = cVar1 + 'p';
            }
            uVar9 = uVar9 + 0x10;
            lVar19 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 0x10;
            auVar40._8_8_ = lVar19 + 0x10;
            lVar19 = auVar56._8_8_;
            auVar56._0_8_ = auVar56._0_8_ + 0x10;
            auVar56._8_8_ = lVar19 + 0x10;
            lVar19 = auVar124._8_8_;
            auVar124._0_8_ = auVar124._0_8_ + 0x10;
            auVar124._8_8_ = lVar19 + 0x10;
            lVar19 = auVar90._8_8_;
            auVar90._0_8_ = auVar90._0_8_ + 0x10;
            auVar90._8_8_ = lVar19 + 0x10;
            lVar19 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 0x10;
            auVar26._8_8_ = lVar19 + 0x10;
            lVar19 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 0x10;
            auVar29._8_8_ = lVar19 + 0x10;
            lVar19 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 0x10;
            auVar32._8_8_ = lVar19 + 0x10;
            lVar19 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 0x10;
            auVar35._8_8_ = lVar19 + 0x10;
          } while (((int)lVar4 + 0xfU & 0x30) != uVar9);
        }
        acStack_800[lVar4] = '\0';
        pcStack_808 = (code *)0x12e965;
        iVar2 = rand_r(__seed);
        lVar4 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar4 != 0) {
          lVar19 = lVar4 + -1;
          auVar15._8_4_ = (int)lVar19;
          auVar15._0_8_ = lVar19;
          auVar15._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar9 = 0;
          auVar17 = _DAT_00147390;
          auVar20 = _DAT_00147380;
          auVar22 = _DAT_00147370;
          auVar24 = _DAT_00147360;
          auVar27 = _DAT_00147350;
          auVar30 = _DAT_00147340;
          auVar33 = _DAT_00147330;
          auVar36 = _DAT_00147320;
          do {
            auVar40 = auVar15 ^ _DAT_001473a0;
            auVar56 = auVar17 ^ _DAT_001473a0;
            iVar2 = auVar40._0_4_;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            iVar105 = auVar40._4_4_;
            auVar58._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar43 = auVar40._8_4_;
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            iVar44 = auVar40._12_4_;
            auVar58._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar88._4_4_ = iVar106;
            auVar88._0_4_ = iVar106;
            auVar88._8_4_ = iVar118;
            auVar88._12_4_ = iVar118;
            auVar40 = pshuflw(in_XMM13,auVar88,0xe8);
            auVar57._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar57._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar57._0_4_ = auVar57._4_4_;
            auVar57._8_4_ = auVar57._12_4_;
            auVar124 = pshuflw(in_XMM14,auVar57,0xe8);
            auVar58._0_4_ = auVar58._4_4_;
            auVar58._8_4_ = auVar58._12_4_;
            auVar56 = pshuflw(auVar40,auVar58,0xe8);
            auVar125._8_4_ = 0xffffffff;
            auVar125._0_8_ = 0xffffffffffffffff;
            auVar125._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar125;
            auVar40 = packssdw(auVar40,auVar40);
            cVar1 = (char)uVar9;
            if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9] = cVar1 + 'a';
            }
            auVar58 = auVar57 & auVar88 | auVar58;
            auVar40 = packssdw(auVar58,auVar58);
            auVar40 = packssdw(auVar40 ^ auVar125,auVar40 ^ auVar125);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 1] = cVar1 + 'b';
            }
            auVar40 = auVar20 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar110._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar110._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar59._4_4_ = iVar106;
            auVar59._0_4_ = iVar106;
            auVar59._8_4_ = iVar118;
            auVar59._12_4_ = iVar118;
            auVar89._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar89._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar40 = auVar89 & auVar59 | auVar110;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar125,auVar40 ^ auVar125);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
              acStack_7e0[uVar9 + 2] = cVar1 + 'c';
            }
            auVar56 = pshufhw(auVar59,auVar59,0x84);
            auVar90 = pshufhw(auVar89,auVar89,0x84);
            auVar124 = pshufhw(auVar56,auVar110,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar125;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._0_4_ >> 0x18 & 1) != 0) {
              acStack_7e0[uVar9 + 3] = cVar1 + 'd';
            }
            auVar56 = auVar22 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar61._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar61._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar91._4_4_ = iVar106;
            auVar91._0_4_ = iVar106;
            auVar91._8_4_ = iVar118;
            auVar91._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar91,0xe8);
            auVar60._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar60._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar124 = pshuflw(auVar125,auVar60,0xe8);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar56 = pshuflw(auVar40,auVar61,0xe8);
            auVar126._8_4_ = 0xffffffff;
            auVar126._0_8_ = 0xffffffffffffffff;
            auVar126._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar126;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 4] = cVar1 + 'e';
            }
            auVar61 = auVar60 & auVar91 | auVar61;
            auVar40 = packssdw(auVar61,auVar61);
            auVar40 = packssdw(auVar40 ^ auVar126,auVar40 ^ auVar126);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._4_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 5] = cVar1 + 'f';
            }
            auVar40 = auVar24 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar111._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar111._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar62._4_4_ = iVar106;
            auVar62._0_4_ = iVar106;
            auVar62._8_4_ = iVar118;
            auVar62._12_4_ = iVar118;
            auVar92._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar92._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar92._0_4_ = auVar92._4_4_;
            auVar92._8_4_ = auVar92._12_4_;
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar40 = auVar92 & auVar62 | auVar111;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar126,auVar40 ^ auVar126);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 6] = cVar1 + 'g';
            }
            auVar56 = pshufhw(auVar62,auVar62,0x84);
            auVar90 = pshufhw(auVar92,auVar92,0x84);
            auVar124 = pshufhw(auVar56,auVar111,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar126;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._6_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 7] = cVar1 + 'h';
            }
            auVar56 = auVar27 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar64._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar64._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar93._4_4_ = iVar106;
            auVar93._0_4_ = iVar106;
            auVar93._8_4_ = iVar118;
            auVar93._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar93,0xe8);
            auVar63._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar63._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar124 = pshuflw(auVar126,auVar63,0xe8);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar56 = pshuflw(auVar40,auVar64,0xe8);
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar127;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 8] = cVar1 + 'i';
            }
            auVar64 = auVar63 & auVar93 | auVar64;
            auVar40 = packssdw(auVar64,auVar64);
            auVar40 = packssdw(auVar40 ^ auVar127,auVar40 ^ auVar127);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._8_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 9] = cVar1 + 'j';
            }
            auVar40 = auVar30 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar112._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar112._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar65._4_4_ = iVar106;
            auVar65._0_4_ = iVar106;
            auVar65._8_4_ = iVar118;
            auVar65._12_4_ = iVar118;
            auVar94._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar94._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar40 = auVar94 & auVar65 | auVar112;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar127,auVar40 ^ auVar127);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 10] = cVar1 + 'k';
            }
            auVar56 = pshufhw(auVar65,auVar65,0x84);
            auVar90 = pshufhw(auVar94,auVar94,0x84);
            auVar124 = pshufhw(auVar56,auVar112,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar127;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._10_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 0xb] = cVar1 + 'l';
            }
            auVar56 = auVar33 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar67._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar67._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar95._4_4_ = iVar106;
            auVar95._0_4_ = iVar106;
            auVar95._8_4_ = iVar118;
            auVar95._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar95,0xe8);
            auVar66._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar66._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar124 = pshuflw(auVar127,auVar66,0xe8);
            auVar67._0_4_ = auVar67._4_4_;
            auVar67._8_4_ = auVar67._12_4_;
            auVar56 = pshuflw(auVar40,auVar67,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ in_XMM14;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 0xc] = cVar1 + 'm';
            }
            auVar67 = auVar66 & auVar95 | auVar67;
            auVar40 = packssdw(auVar67,auVar67);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._12_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 0xd] = cVar1 + 'n';
            }
            auVar40 = auVar36 ^ _DAT_001473a0;
            auVar113._0_4_ = -(uint)(iVar2 < auVar40._0_4_);
            auVar113._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            auVar113._8_4_ = -(uint)(iVar43 < auVar40._8_4_);
            auVar113._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar68._4_4_ = auVar113._0_4_;
            auVar68._0_4_ = auVar113._0_4_;
            auVar68._8_4_ = auVar113._8_4_;
            auVar68._12_4_ = auVar113._8_4_;
            iVar2 = -(uint)(auVar40._4_4_ == iVar105);
            iVar105 = -(uint)(auVar40._12_4_ == iVar44);
            auVar41._4_4_ = iVar2;
            auVar41._0_4_ = iVar2;
            auVar41._8_4_ = iVar105;
            auVar41._12_4_ = iVar105;
            auVar96._4_4_ = auVar113._4_4_;
            auVar96._0_4_ = auVar113._4_4_;
            auVar96._8_4_ = auVar113._12_4_;
            auVar96._12_4_ = auVar113._12_4_;
            in_XMM13 = auVar41 & auVar68 | auVar96;
            auVar40 = packssdw(auVar113,in_XMM13);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_7e0[uVar9 + 0xe] = cVar1 + 'o';
            }
            auVar56 = pshufhw(auVar68,auVar68,0x84);
            auVar40 = pshufhw(auVar41,auVar41,0x84);
            auVar124 = pshufhw(auVar56,auVar96,0x84);
            auVar40 = packssdw(auVar40 & auVar56,(auVar124 | auVar40 & auVar56) ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._14_2_ >> 8 & 1) != 0) {
              acStack_7e0[uVar9 + 0xf] = cVar1 + 'p';
            }
            uVar9 = uVar9 + 0x10;
            lVar19 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 0x10;
            auVar17._8_8_ = lVar19 + 0x10;
            lVar19 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 0x10;
            auVar20._8_8_ = lVar19 + 0x10;
            lVar19 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 0x10;
            auVar22._8_8_ = lVar19 + 0x10;
            lVar19 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 0x10;
            auVar24._8_8_ = lVar19 + 0x10;
            lVar19 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 0x10;
            auVar27._8_8_ = lVar19 + 0x10;
            lVar19 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 0x10;
            auVar30._8_8_ = lVar19 + 0x10;
            lVar19 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 0x10;
            auVar33._8_8_ = lVar19 + 0x10;
            lVar19 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 0x10;
            auVar36._8_8_ = lVar19 + 0x10;
          } while (((int)lVar4 + 0xfU & 0x30) != uVar9);
        }
        acStack_7e0[lVar4] = '\0';
        pcStack_808 = (code *)0x12ef6e;
        bson_append_utf8(uVar6,acStack_800,0xffffffff,acStack_7e0,0xffffffff);
        uVar6 = *(undefined8 *)(__n + (long)pcVar10 * 8);
        pcStack_808 = (code *)0x12ef7a;
        iVar2 = rand_r(__seed);
        lVar4 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar4 != 0) {
          lVar19 = lVar4 + -1;
          auVar16._8_4_ = (int)lVar19;
          auVar16._0_8_ = lVar19;
          auVar16._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar9 = 0;
          auVar18 = _DAT_00147390;
          auVar21 = _DAT_00147380;
          auVar23 = _DAT_00147370;
          auVar25 = _DAT_00147360;
          auVar28 = _DAT_00147350;
          auVar31 = _DAT_00147340;
          auVar34 = _DAT_00147330;
          auVar37 = _DAT_00147320;
          do {
            auVar40 = auVar16 ^ _DAT_001473a0;
            auVar56 = auVar18 ^ _DAT_001473a0;
            iVar2 = auVar40._0_4_;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            iVar105 = auVar40._4_4_;
            auVar70._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar43 = auVar40._8_4_;
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            iVar44 = auVar40._12_4_;
            auVar70._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar97._4_4_ = iVar106;
            auVar97._0_4_ = iVar106;
            auVar97._8_4_ = iVar118;
            auVar97._12_4_ = iVar118;
            auVar40 = pshuflw(in_XMM13,auVar97,0xe8);
            auVar69._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar69._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar124 = pshuflw(in_XMM14,auVar69,0xe8);
            auVar70._0_4_ = auVar70._4_4_;
            auVar70._8_4_ = auVar70._12_4_;
            auVar56 = pshuflw(auVar40,auVar70,0xe8);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar128;
            auVar40 = packssdw(auVar40,auVar40);
            cVar1 = (char)uVar9;
            if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_800[uVar9] = cVar1 + 'a';
            }
            auVar70 = auVar69 & auVar97 | auVar70;
            auVar40 = packssdw(auVar70,auVar70);
            auVar40 = packssdw(auVar40 ^ auVar128,auVar40 ^ auVar128);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 1] = cVar1 + 'b';
            }
            auVar40 = auVar21 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar114._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar114._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar71._4_4_ = iVar106;
            auVar71._0_4_ = iVar106;
            auVar71._8_4_ = iVar118;
            auVar71._12_4_ = iVar118;
            auVar98._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar98._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar98._0_4_ = auVar98._4_4_;
            auVar98._8_4_ = auVar98._12_4_;
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar40 = auVar98 & auVar71 | auVar114;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar128,auVar40 ^ auVar128);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
              acStack_800[uVar9 + 2] = cVar1 + 'c';
            }
            auVar56 = pshufhw(auVar71,auVar71,0x84);
            auVar90 = pshufhw(auVar98,auVar98,0x84);
            auVar124 = pshufhw(auVar56,auVar114,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar128;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._0_4_ >> 0x18 & 1) != 0) {
              acStack_800[uVar9 + 3] = cVar1 + 'd';
            }
            auVar56 = auVar23 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar73._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar73._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar99._4_4_ = iVar106;
            auVar99._0_4_ = iVar106;
            auVar99._8_4_ = iVar118;
            auVar99._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar99,0xe8);
            auVar72._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar72._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar124 = pshuflw(auVar128,auVar72,0xe8);
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar56 = pshuflw(auVar40,auVar73,0xe8);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar129;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 4] = cVar1 + 'e';
            }
            auVar73 = auVar72 & auVar99 | auVar73;
            auVar40 = packssdw(auVar73,auVar73);
            auVar40 = packssdw(auVar40 ^ auVar129,auVar40 ^ auVar129);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._4_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 5] = cVar1 + 'f';
            }
            auVar40 = auVar25 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar115._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar115._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar74._4_4_ = iVar106;
            auVar74._0_4_ = iVar106;
            auVar74._8_4_ = iVar118;
            auVar74._12_4_ = iVar118;
            auVar100._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar100._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar100._0_4_ = auVar100._4_4_;
            auVar100._8_4_ = auVar100._12_4_;
            auVar115._0_4_ = auVar115._4_4_;
            auVar115._8_4_ = auVar115._12_4_;
            auVar40 = auVar100 & auVar74 | auVar115;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar129,auVar40 ^ auVar129);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 6] = cVar1 + 'g';
            }
            auVar56 = pshufhw(auVar74,auVar74,0x84);
            auVar90 = pshufhw(auVar100,auVar100,0x84);
            auVar124 = pshufhw(auVar56,auVar115,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar129;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._6_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 7] = cVar1 + 'h';
            }
            auVar56 = auVar28 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar76._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar76._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar101._4_4_ = iVar106;
            auVar101._0_4_ = iVar106;
            auVar101._8_4_ = iVar118;
            auVar101._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar101,0xe8);
            auVar75._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar75._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar124 = pshuflw(auVar129,auVar75,0xe8);
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar56 = pshuflw(auVar40,auVar76,0xe8);
            auVar130._8_4_ = 0xffffffff;
            auVar130._0_8_ = 0xffffffffffffffff;
            auVar130._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ auVar130;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 8] = cVar1 + 'i';
            }
            auVar76 = auVar75 & auVar101 | auVar76;
            auVar40 = packssdw(auVar76,auVar76);
            auVar40 = packssdw(auVar40 ^ auVar130,auVar40 ^ auVar130);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._8_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 9] = cVar1 + 'j';
            }
            auVar40 = auVar31 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar40._0_4_);
            auVar116._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            iVar118 = -(uint)(iVar43 < auVar40._8_4_);
            auVar116._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar77._4_4_ = iVar106;
            auVar77._0_4_ = iVar106;
            auVar77._8_4_ = iVar118;
            auVar77._12_4_ = iVar118;
            auVar102._4_4_ = -(uint)(auVar40._4_4_ == iVar105);
            auVar102._12_4_ = -(uint)(auVar40._12_4_ == iVar44);
            auVar102._0_4_ = auVar102._4_4_;
            auVar102._8_4_ = auVar102._12_4_;
            auVar116._0_4_ = auVar116._4_4_;
            auVar116._8_4_ = auVar116._12_4_;
            auVar40 = auVar102 & auVar77 | auVar116;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar130,auVar40 ^ auVar130);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 10] = cVar1 + 'k';
            }
            auVar56 = pshufhw(auVar77,auVar77,0x84);
            auVar90 = pshufhw(auVar102,auVar102,0x84);
            auVar124 = pshufhw(auVar56,auVar116,0x84);
            auVar56 = (auVar124 | auVar90 & auVar56) ^ auVar130;
            auVar56 = packssdw(auVar56,auVar56);
            auVar56 = packsswb(auVar56,auVar56);
            if ((auVar56._10_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xb] = cVar1 + 'l';
            }
            auVar56 = auVar34 ^ _DAT_001473a0;
            iVar106 = -(uint)(iVar2 < auVar56._0_4_);
            auVar79._4_4_ = -(uint)(iVar105 < auVar56._4_4_);
            iVar118 = -(uint)(iVar43 < auVar56._8_4_);
            auVar79._12_4_ = -(uint)(iVar44 < auVar56._12_4_);
            auVar103._4_4_ = iVar106;
            auVar103._0_4_ = iVar106;
            auVar103._8_4_ = iVar118;
            auVar103._12_4_ = iVar118;
            auVar40 = pshuflw(auVar40,auVar103,0xe8);
            auVar78._4_4_ = -(uint)(auVar56._4_4_ == iVar105);
            auVar78._12_4_ = -(uint)(auVar56._12_4_ == iVar44);
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar124 = pshuflw(auVar130,auVar78,0xe8);
            auVar79._0_4_ = auVar79._4_4_;
            auVar79._8_4_ = auVar79._12_4_;
            auVar56 = pshuflw(auVar40,auVar79,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar40 = (auVar56 | auVar124 & auVar40) ^ in_XMM14;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 0xc] = cVar1 + 'm';
            }
            auVar79 = auVar78 & auVar103 | auVar79;
            auVar40 = packssdw(auVar79,auVar79);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._12_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xd] = cVar1 + 'n';
            }
            auVar40 = auVar37 ^ _DAT_001473a0;
            auVar117._0_4_ = -(uint)(iVar2 < auVar40._0_4_);
            auVar117._4_4_ = -(uint)(iVar105 < auVar40._4_4_);
            auVar117._8_4_ = -(uint)(iVar43 < auVar40._8_4_);
            auVar117._12_4_ = -(uint)(iVar44 < auVar40._12_4_);
            auVar80._4_4_ = auVar117._0_4_;
            auVar80._0_4_ = auVar117._0_4_;
            auVar80._8_4_ = auVar117._8_4_;
            auVar80._12_4_ = auVar117._8_4_;
            iVar2 = -(uint)(auVar40._4_4_ == iVar105);
            iVar105 = -(uint)(auVar40._12_4_ == iVar44);
            auVar42._4_4_ = iVar2;
            auVar42._0_4_ = iVar2;
            auVar42._8_4_ = iVar105;
            auVar42._12_4_ = iVar105;
            auVar104._4_4_ = auVar117._4_4_;
            auVar104._0_4_ = auVar117._4_4_;
            auVar104._8_4_ = auVar117._12_4_;
            auVar104._12_4_ = auVar117._12_4_;
            in_XMM13 = auVar42 & auVar80 | auVar104;
            auVar40 = packssdw(auVar117,in_XMM13);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_800[uVar9 + 0xe] = cVar1 + 'o';
            }
            auVar56 = pshufhw(auVar80,auVar80,0x84);
            auVar40 = pshufhw(auVar42,auVar42,0x84);
            auVar124 = pshufhw(auVar56,auVar104,0x84);
            auVar40 = packssdw(auVar40 & auVar56,(auVar124 | auVar40 & auVar56) ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._14_2_ >> 8 & 1) != 0) {
              acStack_800[uVar9 + 0xf] = cVar1 + 'p';
            }
            uVar9 = uVar9 + 0x10;
            lVar19 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 0x10;
            auVar18._8_8_ = lVar19 + 0x10;
            lVar19 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 0x10;
            auVar21._8_8_ = lVar19 + 0x10;
            lVar19 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 0x10;
            auVar23._8_8_ = lVar19 + 0x10;
            lVar19 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 0x10;
            auVar25._8_8_ = lVar19 + 0x10;
            lVar19 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 0x10;
            auVar28._8_8_ = lVar19 + 0x10;
            lVar19 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 0x10;
            auVar31._8_8_ = lVar19 + 0x10;
            lVar19 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 0x10;
            auVar34._8_8_ = lVar19 + 0x10;
            lVar19 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 0x10;
            auVar37._8_8_ = lVar19 + 0x10;
          } while (((int)lVar4 + 0xfU & 0x30) != uVar9);
        }
        acStack_800[lVar4] = '\0';
        pcStack_808 = (code *)0x12f56e;
        iVar2 = rand_r(__seed);
        pcStack_808 = (code *)0x12f59e;
        bson_append_int32(uVar6,acStack_800,0xffffffff,
                          iVar2 + ((int)((long)iVar2 * 0x40000001 >> 0x3d) - (iVar2 >> 0x1f)) *
                                  -0x7fffffff);
        uVar11 = (int)pcVar12 + 1;
        pcVar12 = (char *)(ulong)uVar11;
      } while (uVar11 != (uint)pcStack_7b8);
    }
    pcStack_808 = (code *)0x12f5b7;
    lVar4 = bson_as_json(*(undefined8 *)(__n + (long)pcVar10 * 8));
    if (lVar4 == 0) goto LAB_0012f791;
    pcStack_808 = (code *)0x12f5d0;
    bson_string_append(puStack_7c0);
    pcStack_808 = (code *)0x12f5d8;
    bson_free(lVar4);
    pcVar5 = pcStack_798;
    pcVar10 = pcVar10 + 1;
  } while (pcVar10 != pcStack_798);
  pcStack_808 = (code *)0x12f5f1;
  iVar2 = rand_r(__seed);
  pcStack_808 = (code *)0x12f61d;
  pcVar10 = (char *)bson_json_data_reader_new(1,(ulong)(long)iVar2 % 100);
  pcStack_808 = (code *)0x12f633;
  bson_json_data_reader_ingest(pcVar10,*puStack_7c0,*(undefined4 *)(puStack_7c0 + 1));
  pcVar13 = (char *)0x0;
  while( true ) {
    pcVar12 = auStack_780;
    pcStack_808 = (code *)0x12f64a;
    pcStack_7b8 = pcVar13;
    bson_reinit(pcVar12);
    pcStack_808 = (code *)0x12f65d;
    iVar2 = bson_json_reader_read(pcVar10,pcVar12,auStack_6b8);
    if (iVar2 == -1) break;
    if (iVar2 == 0) {
      pcStack_808 = (code *)0x12f8a6;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012f8a6;
    }
    pcStack_808 = (code *)0x12f676;
    pvStack_7a0 = (void *)bson_get_data(pcVar12);
    pcVar12 = pcStack_7b8;
    pcStack_808 = (code *)0x12f689;
    pvStack_7a8 = (void *)bson_get_data(*(undefined8 *)(__n + (long)pcStack_7b8 * 8));
    if (*(int *)(*(long *)(__n + (long)pcVar12 * 8) + 4) != auStack_780._4_4_) goto LAB_0012f796;
    pcStack_808 = (code *)0x12f6a7;
    __s1 = (void *)bson_get_data();
    pcStack_808 = (code *)0x12f6b7;
    __s2 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x12f6c9;
    iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(*(long *)(__n + (long)pcVar12 * 8) + 4));
    pcVar5 = pcStack_798;
    if (iVar2 != 0) goto LAB_0012f796;
    pcVar13 = pcVar12 + 1;
    pcVar12 = auStack_780;
    if (pcStack_798 == pcVar13) goto code_r0x0012f6ed;
  }
  pcStack_808 = (code *)0x12f791;
  test_bson_json_read_buffering_cold_2();
LAB_0012f791:
  pcStack_808 = (code *)0x12f796;
  test_bson_json_read_buffering_cold_9();
LAB_0012f796:
  __seed = (uint *)auStack_780;
  pcStack_808 = (code *)0x12f7a8;
  pcVar5 = (char *)bson_as_canonical_extended_json(__seed);
  pcStack_808 = (code *)0x12f7b6;
  uVar6 = bson_as_canonical_extended_json(*(undefined8 *)(__n + (long)pcVar12 * 8));
  uVar11 = *(uint *)(*(long *)(__n + (long)pcVar12 * 8) + 4);
  if (auStack_780._4_4_ == 0) goto LAB_0012f7eb;
  uVar9 = 0;
  goto LAB_0012f7d2;
  while( true ) {
    if (*(char *)((long)pvStack_7a0 + uVar9) != *(char *)((long)pvStack_7a8 + uVar9))
    goto LAB_0012f89a;
    uVar9 = uVar9 + 1;
    if (auStack_780._4_4_ == (uint)uVar9) break;
LAB_0012f7d2:
    if (uVar11 == (uint)uVar9) break;
  }
LAB_0012f7eb:
  uVar3 = auStack_780._4_4_;
  if ((uint)auStack_780._4_4_ < uVar11) {
    uVar3 = uVar11;
  }
  uVar9 = (ulong)(uVar3 - 1);
  while( true ) {
    pcStack_808 = (code *)0x12f810;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,pcVar5,uVar6);
    pcStack_808 = (code *)0x12f828;
    uVar11 = open("failure.bad.bson",0x42,0x1a0);
    pcVar12 = (char *)(ulong)uVar11;
    pcStack_808 = (code *)0x12f843;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar11 == 0xffffffff) break;
    __seed = (uint *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0012f8ab;
    pcVar5 = (char *)(ulong)(uint)auStack_780._4_4_;
    pcStack_808 = (code *)0x12f869;
    pcVar13 = (char *)write(uVar11,pvStack_7a0,(size_t)pcVar5);
    if (pcVar13 != pcVar5) goto LAB_0012f8b0;
    __n = (ulong)*(uint *)(*(long *)(__n + (long)pcStack_7b8 * 8) + 4);
    pcStack_808 = (code *)0x12f88a;
    uVar9 = write(uVar3,pvStack_7a8,__n);
    if (uVar9 != __n) goto LAB_0012f8b5;
    uVar9 = (ulong)uVar3;
    pcStack_808 = (code *)0x12f89a;
    test_bson_json_read_buffering_cold_5();
    uVar6 = extraout_RAX;
LAB_0012f89a:
    uVar9 = uVar9 & 0xffffffff;
  }
LAB_0012f8a6:
  pcStack_808 = (code *)0x12f8ab;
  test_bson_json_read_buffering_cold_7();
LAB_0012f8ab:
  pcStack_808 = (code *)0x12f8b0;
  test_bson_json_read_buffering_cold_6();
LAB_0012f8b0:
  pcStack_808 = (code *)0x12f8b5;
  test_bson_json_read_buffering_cold_3();
LAB_0012f8b5:
  pcStack_808 = (code *)0x12f8ba;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012f8ba;
code_r0x0012f6ed:
  pcStack_808 = (code *)0x12f700;
  iVar2 = bson_json_reader_read(pcVar10,pcVar12,auStack_6b8);
  if (iVar2 != 0) {
LAB_0012f8ba:
    pcStack_808 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    uStack_830 = __n;
    pcStack_828 = pcVar5;
    pcStack_820 = pcVar10;
    pcStack_818 = pcVar12;
    puStack_810 = __seed;
    pcStack_808 = (code *)apcStack_408;
    bson_oid_init_from_string(auStack_83c,"000000000000000000000000");
    uVar6 = bson_bcon_magic();
    uVar7 = bcon_new(0x405edd2f1a9fbe77,0,"foo","bar","bar",uVar6,0xf,0x3035,"baz",uVar6,1,"map","{"
                     ,"a",uVar6,0xf,1,"}","array","[",uVar6,0xf,1,uVar6,0xf,2,uVar6,0xf,3,uVar6,0xf,
                     4,"]","null",uVar6,9,"boolean",uVar6,7,1,"oid",uVar6,6,auStack_83c,"binary",
                     uVar6,4,0,"deadbeef",8,"regex",uVar6,10,"foo|bar","ism","date",uVar6,8,10000,
                     "ref","{","$ref",uVar6,0,"foo","$id",uVar6,6,auStack_83c);
    uVar8 = bcon_new(0,"after","b",0);
    iVar2 = 0x149eee;
    uVar6 = bcon_new(0,"twice",uVar6,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar2,uVar7,uVar8,uVar6,0);
    return;
  }
  pcStack_808 = (code *)0x12f710;
  bson_json_reader_destroy(pcVar10);
  pcStack_808 = (code *)0x12f71c;
  bson_string_truncate(puStack_7c0);
  pcVar12 = (char *)0x0;
  do {
    pcStack_808 = (code *)0x12f728;
    bson_destroy(*(undefined8 *)(__n + (long)pcVar12 * 8));
    pcVar12 = pcVar12 + 1;
  } while (pcVar5 != pcVar12);
  pcStack_808 = (code *)0x12f738;
  bson_free(__n);
  iVar2 = iStack_7ac + 1;
  if (iVar2 == 0x32) goto code_r0x0012f74c;
  goto LAB_0012e319;
code_r0x0012f74c:
  pcVar5 = pcVar5 + 1;
  if (pcVar5 == (char *)0xa) {
    pcStack_808 = (code *)0x12f768;
    bson_string_free(puStack_7c0,1);
    pcStack_808 = (code *)0x12f775;
    bson_destroy(auStack_780);
    return;
  }
  goto LAB_0012e305;
}

Assistant:

static void
test_bson_json_allow_multiple (void)
{
   int32_t one;
   bson_error_t error;
   bson_json_reader_t *reader;
   bson_json_reader_t *reader_multiple;
   bson_t bson = BSON_INITIALIZER;
   bool allow_multiple = true;
   char *multiple_json = "{\"a\": 1}{\"b\": 1}";

   reader = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, !allow_multiple, 0);
   reader_multiple = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, allow_multiple, 0);
   BSON_ASSERT (reader);
   BSON_ASSERT (reader_multiple);

   /* reader with allow_multiple false */
   /* read first json */
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* reader_multiple with allow_multiple true */
   /* read first json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   bson_json_reader_destroy (reader);
   bson_json_reader_destroy (reader_multiple);
   bson_destroy (&bson);
}